

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O1

void __thiscall miniros::RPCManager::releaseXMLRPCClient(RPCManager *this,XmlRpcClient *c)

{
  pointer *ppCVar1;
  pointer __dest;
  int iVar2;
  pointer pCVar3;
  pointer __src;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->clients_mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pCVar3 = (this->clients_).
           super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __dest = pCVar3;
  do {
    if (pCVar3 == (this->clients_).
                  super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001f7c00:
      pthread_mutex_unlock((pthread_mutex_t *)&this->clients_mutex_);
      return;
    }
    __src = __dest + 1;
    if (pCVar3->client_ == c) {
      if (((this->shutting_down_)._M_base._M_i & 1U) == 0) {
        pCVar3->in_use_ = false;
      }
      else {
        (*(pCVar3->client_->super_XmlRpcSource)._vptr_XmlRpcSource[2])();
        if (pCVar3->client_ != (XmlRpcClient *)0x0) {
          (*(pCVar3->client_->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
        }
        pCVar3 = (this->clients_).
                 super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__src != pCVar3) {
          memmove(__dest,__src,(long)pCVar3 - (long)__src);
        }
        ppCVar1 = &(this->clients_).
                   super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + -1;
      }
      goto LAB_001f7c00;
    }
    pCVar3 = pCVar3 + 1;
    __dest = __src;
  } while( true );
}

Assistant:

void RPCManager::releaseXMLRPCClient(XmlRpcClient *c)
{
  std::scoped_lock<std::mutex> lock(clients_mutex_);

  for (auto i = clients_.begin(); i != clients_.end(); ++i)
  {
    if (c == i->client_)
    {
      if (shutting_down_)
      {
        // if we are shutting down we won't be re-using the client
        i->client_->close();
        delete i->client_;
        clients_.erase(i);
      }
      else
      {
        i->in_use_ = false;
      }
      break;
    }
  }
}